

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O2

ostream * tchecker::parsing::operator<<(ostream *os,sync_constraint_t *c)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,(string *)
                              &((c->_process).
                                super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_name);
  poVar1 = std::operator<<(poVar1,"@");
  poVar1 = std::operator<<(poVar1,(string *)
                                  &((c->_event).
                                    super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_name);
  poVar1 = tchecker::operator<<(poVar1,c->_strength);
  return poVar1;
}

Assistant:

std::ostream & operator<<(std::ostream & os, tchecker::parsing::sync_constraint_t const & c)
{
  return os << c._process->name() << "@" << c._event->name() << c._strength;
}